

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pollfd.c
# Opt level: O3

void lws_same_vh_protocol_insert(lws *wsi,int n)

{
  lws_dll2_remove(&wsi->same_vh_protocol);
  lws_dll2_add_head(&wsi->same_vh_protocol,((wsi->a).vhost)->same_vh_protocol_owner + n);
  wsi->bound_vhost_index = (uint8_t)n;
  return;
}

Assistant:

void
lws_same_vh_protocol_insert(struct lws *wsi, int n)
{
	lws_context_lock(wsi->a.context, __func__);
	lws_vhost_lock(wsi->a.vhost);

	lws_dll2_remove(&wsi->same_vh_protocol);
	lws_dll2_add_head(&wsi->same_vh_protocol,
			  &wsi->a.vhost->same_vh_protocol_owner[n]);

	wsi->bound_vhost_index = (uint8_t)n;

	lws_vhost_unlock(wsi->a.vhost);
	lws_context_unlock(wsi->a.context);
}